

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

int __thiscall ncnn::Gemm_x86::create_pipeline_int8(Gemm_x86 *this,Option *opt)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  Allocator *pAVar6;
  size_t sVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Option *pOVar12;
  int iVar13;
  undefined1 *puVar14;
  undefined8 *puVar15;
  undefined1 *puVar16;
  long lVar17;
  long lVar18;
  undefined1 *puVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  Mat *pMVar23;
  undefined1 *puVar24;
  Mat *pMVar25;
  int iVar26;
  int iVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  long lVar31;
  undefined1 *puVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  undefined1 *puVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  Mat *pMVar41;
  Mat *pMVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 *local_168;
  int TILE_M;
  undefined1 *local_158;
  undefined1 *local_150;
  Mat *local_148;
  long local_140;
  int local_138;
  int local_134;
  Mat *local_130;
  ulong local_128;
  undefined1 *local_120;
  int TILE_N;
  Option *local_110;
  long local_108;
  undefined1 *local_100;
  Gemm_x86 *local_f8;
  ulong local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  Mat *local_d8;
  int local_cc;
  int local_c8;
  int TILE_K;
  Mat *local_c0;
  Mat *local_b8;
  ulong local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  int TILE_M_1;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  local_110 = opt;
  local_f8 = this;
  if ((this->super_Gemm).constantA == 0) {
LAB_004294ea:
    if ((this->super_Gemm).constantB != 0) {
      uVar2 = (this->super_Gemm).constantN;
      uVar3 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar2,uVar3,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N
                 ,(this->super_Gemm).constant_TILE_K,&TILE_M_1,&TILE_M,&TILE_N,
                 local_110->num_threads);
      iVar34 = TILE_N;
      iVar27 = (int)(uVar2 + TILE_M + -1) / TILE_M;
      local_f0 = (ulong)uVar3;
      local_b0 = (ulong)uVar2;
      Mat::create(&this->BT_data,TILE_M * TILE_N,(int)(uVar3 + TILE_N + -1) / TILE_N,iVar27,1,
                  (Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_00429ee8;
      local_b8 = &(this->super_Gemm).B_data;
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      for (iVar26 = 0; iVar26 != iVar27; iVar26 = iVar26 + 1) {
        iVar13 = TILE_M * iVar26;
        local_138 = (int)local_b0 - iVar13;
        local_130 = (Mat *)(long)iVar13;
        local_c0 = (Mat *)((long)&local_130->data + 1);
        local_80 = (undefined1 *)((long)&local_130->data + 2);
        local_88 = (undefined1 *)((long)&local_130->data + 3);
        local_90 = (undefined1 *)((long)&local_130->data + 4);
        local_98 = (undefined1 *)((long)&local_130->data + 5);
        local_a0 = (undefined1 *)((long)&local_130->data + 6);
        local_a8 = (undefined1 *)((long)&local_130->data + 7);
        iVar22 = 0;
        while (iVar35 = iVar22, iVar22 = (int)local_f0 - iVar35,
              iVar22 != 0 && iVar35 <= (int)local_f0) {
          iVar8 = local_138;
          if (TILE_M < local_138) {
            iVar8 = TILE_M;
          }
          if (iVar34 < iVar22) {
            iVar22 = iVar34;
          }
          sVar7 = (this->BT_data).elemsize;
          pauVar28 = (undefined1 (*) [16])
                     ((long)(this->BT_data).data +
                     (long)(this->BT_data).w * sVar7 * (long)(iVar35 / iVar34) +
                     (long)(iVar13 / TILE_M) * (this->BT_data).cstep * sVar7);
          local_108 = (long)iVar35;
          local_140 = (long)iVar8;
          if ((this->super_Gemm).transB == 0) {
            iVar34 = (this->super_Gemm).B_data.w;
            lVar18 = (long)iVar34;
            iVar8 = iVar34 * 2;
            local_168 = (undefined1 *)((long)&local_130->data + lVar18);
            puVar14 = (undefined1 *)((long)&local_130->data + (long)(iVar34 + 1));
            puVar39 = (undefined1 *)((long)&local_130->data + (long)(iVar34 + 3));
            puVar24 = (undefined1 *)((long)&local_130->data + (long)(iVar34 + 2));
            pMVar42 = local_130;
            local_148 = local_c0;
            for (uVar20 = 0; puVar16 = puVar24, puVar32 = puVar39, (long)(uVar20 | 7) < local_140;
                uVar20 = uVar20 + 8) {
              lVar36 = (this->super_Gemm).B_data.w * local_108 * (this->super_Gemm).B_data.elemsize;
              pvVar4 = (this->super_Gemm).B_data.data;
              puVar39 = (undefined1 *)((long)&pMVar42->data + (long)pvVar4);
              puVar24 = (undefined1 *)((long)pvVar4 + (long)local_168);
              for (iVar34 = 0; iVar34 + 1 < iVar22; iVar34 = iVar34 + 2) {
                uVar29 = *(ulong *)(puVar39 + lVar36);
                uVar1 = *(undefined8 *)(puVar24 + lVar36);
                auVar51._8_6_ = 0;
                auVar51._0_8_ = uVar29;
                auVar51[0xe] = (char)(uVar29 >> 0x38);
                auVar51[0xf] = (char)((ulong)uVar1 >> 0x38);
                auVar50._14_2_ = auVar51._14_2_;
                auVar50._8_5_ = 0;
                auVar50._0_8_ = uVar29;
                auVar50[0xd] = (char)((ulong)uVar1 >> 0x30);
                auVar49._13_3_ = auVar50._13_3_;
                auVar49._8_4_ = 0;
                auVar49._0_8_ = uVar29;
                auVar49[0xc] = (char)(uVar29 >> 0x30);
                auVar48._12_4_ = auVar49._12_4_;
                auVar48._8_3_ = 0;
                auVar48._0_8_ = uVar29;
                auVar48[0xb] = (char)((ulong)uVar1 >> 0x28);
                auVar47._11_5_ = auVar48._11_5_;
                auVar47._8_2_ = 0;
                auVar47._0_8_ = uVar29;
                auVar47[10] = (char)(uVar29 >> 0x28);
                auVar46._10_6_ = auVar47._10_6_;
                auVar46[8] = 0;
                auVar46._0_8_ = uVar29;
                auVar46[9] = (char)((ulong)uVar1 >> 0x20);
                auVar45._9_7_ = auVar46._9_7_;
                auVar45[8] = (char)(uVar29 >> 0x20);
                auVar45._0_8_ = uVar29;
                auVar44._8_8_ = auVar45._8_8_;
                auVar44[7] = (char)((ulong)uVar1 >> 0x18);
                auVar44[6] = (char)(uVar29 >> 0x18);
                auVar44[5] = (char)((ulong)uVar1 >> 0x10);
                auVar44[4] = (char)(uVar29 >> 0x10);
                auVar44[3] = (char)((ulong)uVar1 >> 8);
                auVar44[2] = (char)(uVar29 >> 8);
                auVar44[0] = (undefined1)uVar29;
                auVar44[1] = (char)uVar1;
                *pauVar28 = auVar44;
                pauVar28 = pauVar28 + 1;
                puVar39 = puVar39 + iVar8;
                puVar24 = puVar24 + iVar8;
              }
              puVar15 = (undefined8 *)(puVar39 + lVar36);
              for (; iVar34 < iVar22; iVar34 = iVar34 + 1) {
                *(undefined8 *)*pauVar28 = *puVar15;
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
                puVar15 = (undefined8 *)((long)puVar15 + lVar18);
              }
              pMVar42 = (Mat *)&pMVar42->refcount;
              local_168 = local_168 + 8;
              puVar14 = puVar14 + 8;
              local_148 = (Mat *)&local_148->refcount;
              puVar39 = puVar32 + 8;
              puVar24 = puVar16 + 8;
              local_158 = puVar16;
              local_150 = puVar32;
            }
            for (; puVar40 = puVar16, puVar24 = puVar32, puVar39 = puVar14,
                (long)(uVar20 | 3) < local_140; uVar20 = uVar20 + 4) {
              pvVar4 = (this->super_Gemm).B_data.data;
              lVar36 = (this->super_Gemm).B_data.w * local_108 * (this->super_Gemm).B_data.elemsize;
              puVar14 = (undefined1 *)((long)&pMVar42->data + (long)pvVar4);
              puVar32 = puVar24 + (long)pvVar4;
              puVar16 = puVar40 + (long)pvVar4;
              puVar38 = (undefined1 *)((long)pvVar4 + (long)puVar39);
              puVar37 = (undefined1 *)((long)pvVar4 + (long)local_168);
              puVar19 = (undefined1 *)((long)&local_148->data + (long)(lVar36 + (long)pvVar4));
              for (iVar34 = 1; iVar34 < iVar22; iVar34 = iVar34 + 2) {
                (*pauVar28)[0] = puVar14[lVar36];
                (*pauVar28)[1] = puVar37[lVar36];
                (*pauVar28)[2] = puVar14[lVar36 + 1];
                (*pauVar28)[3] = puVar38[lVar36];
                (*pauVar28)[4] = puVar14[lVar36 + 2];
                (*pauVar28)[5] = puVar16[lVar36];
                (*pauVar28)[6] = puVar14[lVar36 + 3];
                (*pauVar28)[7] = puVar32[lVar36];
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
                puVar14 = puVar14 + iVar8;
                puVar32 = puVar32 + iVar8;
                puVar16 = puVar16 + iVar8;
                puVar38 = puVar38 + iVar8;
                puVar37 = puVar37 + iVar8;
                puVar19 = puVar19 + iVar8;
              }
              for (iVar34 = iVar34 + -1; iVar34 < iVar22; iVar34 = iVar34 + 1) {
                (*pauVar28)[0] = puVar19[-1];
                (*pauVar28)[1] = *puVar19;
                (*pauVar28)[2] = puVar19[1];
                (*pauVar28)[3] = puVar19[2];
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 4);
                puVar19 = puVar19 + lVar18;
              }
              pMVar42 = (Mat *)((long)&pMVar42->data + 4);
              local_168 = local_168 + 4;
              local_148 = (Mat *)((long)&local_148->data + 4);
              puVar14 = puVar39 + 4;
              puVar32 = puVar24 + 4;
              puVar16 = puVar40 + 4;
              this = local_f8;
              local_158 = puVar40;
              local_150 = puVar24;
              local_120 = puVar39;
            }
            for (; (long)(uVar20 | 1) < local_140; uVar20 = uVar20 + 2) {
              pvVar4 = (this->super_Gemm).B_data.data;
              lVar36 = (this->super_Gemm).B_data.w * local_108 * (this->super_Gemm).B_data.elemsize;
              puVar14 = (undefined1 *)((long)&pMVar42->data + (long)pvVar4);
              puVar24 = (undefined1 *)((long)pvVar4 + (long)puVar39);
              puVar32 = (undefined1 *)((long)pvVar4 + (long)local_168);
              for (iVar34 = 1; iVar34 < iVar22; iVar34 = iVar34 + 2) {
                (*pauVar28)[0] = puVar14[lVar36];
                (*pauVar28)[1] = puVar32[lVar36];
                (*pauVar28)[2] = puVar14[lVar36 + 1];
                (*pauVar28)[3] = puVar24[lVar36];
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 4);
                puVar14 = puVar14 + iVar8;
                puVar24 = puVar24 + iVar8;
                puVar32 = puVar32 + iVar8;
              }
              for (iVar34 = iVar34 + -1; iVar34 < iVar22; iVar34 = iVar34 + 1) {
                (*pauVar28)[0] = puVar14[lVar36];
                (*pauVar28)[1] = puVar14[lVar36 + 1];
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 2);
                lVar36 = lVar36 + lVar18;
              }
              pMVar42 = (Mat *)((long)&pMVar42->data + 2);
              puVar39 = puVar39 + 2;
              local_168 = local_168 + 2;
            }
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            for (; (long)uVar20 < local_140; uVar20 = uVar20 + 1) {
              puVar14 = (undefined1 *)
                        ((long)&local_130->data +
                        (long)(this->super_Gemm).B_data.data +
                        uVar20 + (this->super_Gemm).B_data.w * local_108 *
                                 (this->super_Gemm).B_data.elemsize);
              iVar34 = iVar22;
              while (bVar43 = iVar34 != 0, iVar34 = iVar34 + -1, bVar43) {
                (*pauVar28)[0] = *puVar14;
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 1);
                puVar14 = puVar14 + lVar18;
              }
            }
          }
          else {
            puVar14 = local_a8;
            pMVar42 = local_c0;
            puVar39 = local_a0;
            puVar24 = local_88;
            puVar32 = (undefined1 *)0x0;
            pMVar23 = local_130;
            local_168 = local_80;
            local_158 = local_90;
            local_150 = local_98;
            while (pMVar41 = pMVar23, puVar37 = puVar32, puVar38 = puVar24, puVar40 = puVar39,
                  pMVar25 = pMVar42, puVar16 = puVar14, (long)((ulong)puVar37 | 7) < local_140) {
              sVar7 = (this->super_Gemm).B_data.elemsize;
              local_128 = (ulong)(this->super_Gemm).B_data.w;
              pvVar4 = (this->super_Gemm).B_data.data;
              lVar18 = sVar7 * (long)pMVar41 * local_128 + local_108;
              lVar36 = sVar7 * (long)pMVar25 * local_128 + local_108;
              lVar21 = sVar7 * (long)local_168 * local_128 + local_108;
              lVar31 = sVar7 * (long)puVar38 * local_128 + local_108;
              lVar17 = sVar7 * (long)local_158 * local_128 + local_108;
              lVar9 = sVar7 * (long)local_150 * local_128 + local_108;
              lVar10 = sVar7 * (long)puVar40 * local_128 + local_108;
              lVar11 = sVar7 * (long)puVar16 * local_128 + local_108;
              pauVar30 = pauVar28;
              for (lVar33 = 0; (int)lVar33 + 1 < iVar22; lVar33 = lVar33 + 2) {
                (*pauVar28)[lVar33 * 8] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar18);
                (*pauVar28)[lVar33 * 8 + 1] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar18 + 1);
                (*pauVar28)[lVar33 * 8 + 2] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar36);
                (*pauVar28)[lVar33 * 8 + 3] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar36 + 1);
                (*pauVar28)[lVar33 * 8 + 4] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar21);
                (*pauVar28)[lVar33 * 8 + 5] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar21 + 1);
                (*pauVar28)[lVar33 * 8 + 6] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar31);
                (*pauVar28)[lVar33 * 8 + 7] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar31 + 1);
                (*pauVar28)[lVar33 * 8 + 8] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar17);
                (*pauVar28)[lVar33 * 8 + 9] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar17 + 1);
                (*pauVar28)[lVar33 * 8 + 10] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar9);
                (*pauVar28)[lVar33 * 8 + 0xb] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar9 + 1);
                (*pauVar28)[lVar33 * 8 + 0xc] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar10);
                (*pauVar28)[lVar33 * 8 + 0xd] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar10 + 1);
                (*pauVar28)[lVar33 * 8 + 0xe] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar11);
                (*pauVar28)[lVar33 * 8 + 0xf] = *(undefined1 *)((long)pvVar4 + lVar33 + lVar11 + 1);
                pauVar30 = pauVar30 + 1;
              }
              lVar18 = sVar7 * local_128;
              pauVar28 = pauVar30;
              for (; (int)lVar33 < iVar22; lVar33 = lVar33 + 1) {
                puVar14 = (undefined1 *)((long)pvVar4 + lVar33 + lVar18 * (long)pMVar41 + local_108)
                ;
                (*pauVar28)[0] = *puVar14;
                (*pauVar28)[1] = puVar14[lVar18];
                (*pauVar28)[2] = puVar14[lVar18 * 2];
                (*pauVar28)[3] = puVar14[lVar18 * 3];
                (*pauVar28)[4] = puVar14[lVar18 * 4];
                (*pauVar28)[5] = puVar14[lVar18 * 5];
                (*pauVar28)[6] = puVar14[lVar18 * 6];
                (*pauVar28)[7] = puVar14[lVar18 * 7];
                pauVar28 = (undefined1 (*) [16])(*pauVar28 + 8);
              }
              local_168 = local_168 + 8;
              local_158 = local_158 + 8;
              local_150 = local_150 + 8;
              puVar14 = puVar16 + 8;
              pMVar42 = (Mat *)&pMVar25->refcount;
              puVar39 = puVar40 + 8;
              puVar24 = puVar38 + 8;
              this = local_f8;
              pMVar23 = (Mat *)&pMVar41->refcount;
              local_148 = pMVar41;
              local_120 = puVar37;
              local_100 = puVar16;
              local_e8 = puVar40;
              local_e0 = puVar38;
              local_d8 = pMVar25;
              puVar32 = puVar37 + 8;
            }
            for (; (long)((ulong)puVar37 | 3) < local_140; puVar37 = puVar37 + 4) {
              sVar7 = (this->super_Gemm).B_data.elemsize;
              lVar31 = (long)(this->super_Gemm).B_data.w;
              pvVar4 = (this->super_Gemm).B_data.data;
              lVar18 = sVar7 * (long)pMVar41 * lVar31 + local_108;
              lVar36 = sVar7 * (long)pMVar25 * lVar31 + local_108;
              lVar21 = sVar7 * (long)local_168 * lVar31 + local_108;
              lVar31 = sVar7 * (long)puVar38 * lVar31 + local_108;
              pauVar30 = pauVar28;
              for (lVar17 = 0; (int)lVar17 + 1 < iVar22; lVar17 = lVar17 + 2) {
                (*pauVar28)[lVar17 * 4] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar18);
                (*pauVar28)[lVar17 * 4 + 1] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar18 + 1);
                (*pauVar28)[lVar17 * 4 + 2] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar36);
                (*pauVar28)[lVar17 * 4 + 3] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar36 + 1);
                (*pauVar28)[lVar17 * 4 + 4] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar21);
                (*pauVar28)[lVar17 * 4 + 5] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar21 + 1);
                (*pauVar28)[lVar17 * 4 + 6] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar31);
                (*pauVar28)[lVar17 * 4 + 7] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar31 + 1);
                pauVar30 = (undefined1 (*) [16])(*pauVar30 + 8);
              }
              for (; (int)lVar17 < iVar22; lVar17 = lVar17 + 1) {
                (*pauVar28)[lVar17 * 4] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar18);
                (*pauVar28)[lVar17 * 4 + 1] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar36);
                (*pauVar28)[lVar17 * 4 + 2] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar21);
                (*pauVar28)[lVar17 * 4 + 3] = *(undefined1 *)((long)pvVar4 + lVar17 + lVar31);
                pauVar30 = (undefined1 (*) [16])(*pauVar30 + 4);
              }
              pMVar41 = (Mat *)((long)&pMVar41->data + 4);
              pMVar25 = (Mat *)((long)&pMVar25->data + 4);
              local_168 = local_168 + 4;
              puVar38 = puVar38 + 4;
              pauVar28 = pauVar30;
            }
            for (; (long)((ulong)puVar37 | 1) < local_140; puVar37 = puVar37 + 2) {
              sVar7 = (this->super_Gemm).B_data.elemsize;
              lVar36 = (long)(this->super_Gemm).B_data.w;
              pvVar4 = (this->super_Gemm).B_data.data;
              lVar18 = sVar7 * (long)pMVar41 * lVar36 + local_108;
              lVar36 = sVar7 * (long)pMVar25 * lVar36 + local_108;
              pauVar30 = pauVar28;
              for (lVar21 = 0; (int)lVar21 + 1 < iVar22; lVar21 = lVar21 + 2) {
                (*pauVar28)[lVar21 * 2] = *(undefined1 *)((long)pvVar4 + lVar21 + lVar18);
                (*pauVar28)[lVar21 * 2 + 1] = *(undefined1 *)((long)pvVar4 + lVar21 + lVar18 + 1);
                (*pauVar28)[lVar21 * 2 + 2] = *(undefined1 *)((long)pvVar4 + lVar21 + lVar36);
                (*pauVar28)[lVar21 * 2 + 3] = *(undefined1 *)((long)pvVar4 + lVar21 + lVar36 + 1);
                pauVar30 = (undefined1 (*) [16])(*pauVar30 + 4);
              }
              for (; pauVar28 = pauVar30, (int)lVar21 < iVar22; lVar21 = lVar21 + 1) {
                (*pauVar28)[0] = *(undefined1 *)((long)pvVar4 + lVar21 + lVar18);
                (*pauVar28)[1] = *(undefined1 *)((long)pvVar4 + lVar21 + lVar36);
                pauVar30 = (undefined1 (*) [16])(*pauVar28 + 2);
              }
              pMVar41 = (Mat *)((long)&pMVar41->data + 2);
              pMVar25 = (Mat *)((long)&pMVar25->data + 2);
            }
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            for (; (long)puVar37 < local_140; puVar37 = puVar37 + 1) {
              iVar34 = (this->super_Gemm).B_data.w;
              pvVar4 = (this->super_Gemm).B_data.data;
              sVar7 = (this->super_Gemm).B_data.elemsize;
              for (lVar18 = 0; iVar22 != (int)lVar18; lVar18 = lVar18 + 1) {
                (*pauVar28)[lVar18] =
                     *(undefined1 *)
                      ((long)pvVar4 + lVar18 + sVar7 * (long)pMVar41 * (long)iVar34 + local_108);
              }
              pauVar28 = (undefined1 (*) [16])(*pauVar28 + lVar18);
              pMVar41 = (Mat *)((long)&pMVar41->data + 1);
            }
          }
          iVar34 = TILE_N;
          local_134 = iVar35;
          iVar22 = iVar35 + TILE_N;
        }
        local_c8 = iVar26;
      }
      local_cc = iVar27;
      if (local_110->lightmode != false) {
        piVar5 = (this->super_Gemm).B_data.refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pAVar6 = (this->super_Gemm).B_data.allocator;
            if (pAVar6 == (Allocator *)0x0) {
              free((this->super_Gemm).B_data.data);
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&local_b8->refcount + 4) = (undefined1  [16])0x0;
        local_b8->data = (void *)0x0;
        local_b8->refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    pOVar12 = local_110;
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar5 = (this->super_Gemm).C_data.refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (this->CT_data).refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pAVar6 = (this->CT_data).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            free((this->CT_data).data);
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (this->super_Gemm).C_data.data;
      (this->CT_data).refcount = piVar5;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar34 = (this->super_Gemm).C_data.w;
      iVar27 = (this->super_Gemm).C_data.h;
      iVar26 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar34;
      (this->CT_data).h = iVar27;
      (this->CT_data).d = iVar26;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (pOVar12->lightmode == true) {
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pAVar6 = (this->super_Gemm).C_data.allocator;
            if (pAVar6 == (Allocator *)0x0) {
              free((this->super_Gemm).C_data.data);
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    iVar34 = 0;
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       ((this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = pOVar12->num_threads;
    }
  }
  else {
    uVar2 = (this->super_Gemm).constantM;
    uVar3 = (this->super_Gemm).constantK;
    local_100 = (undefined1 *)(ulong)uVar3;
    get_optimal_tile_mnk_int8
              (uVar2,0,uVar3,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar27 = TILE_K;
    iVar34 = TILE_M;
    iVar22 = (int)(uVar2 + TILE_M + -1) / TILE_M;
    iVar26 = iVar27;
    local_f0 = (ulong)uVar2;
    if (3 < TILE_K) {
      iVar13 = cpu_support_x86_avx512_vnni();
      bVar43 = true;
      if (iVar13 == 0) {
        iVar13 = cpu_support_x86_avx_vnni();
        bVar43 = iVar13 != 0;
      }
      iVar13 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar43 ^ 1U | iVar13 != 0)) {
        if (iVar34 < 0x10) {
          if (iVar34 < 8) {
            if (iVar34 < 4) {
              iVar26 = (uint)(1 < iVar34) * 4 + 4;
            }
            else {
              iVar26 = 0x10;
            }
          }
          else {
            iVar26 = 0x20;
          }
        }
        else {
          iVar26 = 0x40;
        }
        iVar26 = iVar26 + iVar27;
      }
    }
    Mat::create(&this->AT_data,iVar26 * iVar34,((int)local_100 + iVar27 + -1) / iVar27,iVar22,1,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      local_130 = &(this->super_Gemm).A_data;
      iVar34 = 0;
      local_138 = iVar22;
      while (iVar34 != local_138) {
        local_e8 = (undefined1 *)CONCAT44(local_e8._4_4_,(int)local_f0 - TILE_M * iVar34);
        uVar20 = (ulong)(TILE_M * iVar34);
        local_108 = uVar20 + 1;
        iVar26 = 0;
        local_134 = iVar34;
        local_128 = uVar20;
        while (iVar34 = (int)local_100 - iVar26, iVar34 != 0 && iVar26 <= (int)local_100) {
          iVar22 = (int)local_e8;
          if (TILE_M < (int)local_e8) {
            iVar22 = TILE_M;
          }
          if (iVar27 < iVar34) {
            iVar34 = iVar27;
          }
          local_68 = (this->AT_data).elemsize;
          local_4c = (this->AT_data).w;
          local_38 = (size_t)local_4c;
          local_60 = (this->AT_data).elempack;
          local_58 = (this->AT_data).allocator;
          _TILE_M_1 = (undefined1 *)
                      ((long)(this->AT_data).data +
                      local_68 * local_38 * (long)(iVar26 / iVar27) +
                      (long)(int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 |
                                        uVar20 & 0xffffffff) / (long)TILE_M) * (this->AT_data).cstep
                      * local_68);
          local_70 = (int *)0x0;
          local_50 = 2;
          local_48._0_4_ = 1;
          local_48._4_4_ = 1;
          local_40 = 1;
          local_e0 = (undefined1 *)CONCAT44(local_e0._4_4_,iVar26);
          if ((this->super_Gemm).transA == 0) {
            pack_A_tile_int8(local_130,(Mat *)&TILE_M_1,(int)uVar20,iVar22,iVar26,iVar34);
          }
          else {
            iVar27 = (this->super_Gemm).A_data.w;
            lVar18 = (long)iVar27;
            local_120 = (undefined1 *)(long)iVar26;
            lVar36 = (long)(iVar27 * 2);
            local_d8 = (Mat *)(long)iVar22;
            local_168 = (undefined1 *)(uVar20 + lVar18);
            local_140 = local_108;
            puVar14 = _TILE_M_1;
            pMVar42 = (Mat *)((long)(iVar27 + 3) + uVar20);
            puVar39 = (undefined1 *)((long)(iVar27 + 1) + uVar20);
            puVar24 = (undefined1 *)((long)(iVar27 + 2) + uVar20);
            for (uVar29 = 0; puVar16 = puVar24, puVar32 = puVar39, pMVar23 = pMVar42,
                (long)(uVar29 | 3) < (long)local_d8; uVar29 = uVar29 + 4) {
              pvVar4 = (this->super_Gemm).A_data.data;
              lVar17 = (long)(this->super_Gemm).A_data.w * (long)local_120 *
                       (this->super_Gemm).A_data.elemsize;
              lVar21 = (long)pvVar4 + uVar20;
              puVar39 = (undefined1 *)((long)&pMVar23->data + (long)pvVar4);
              puVar24 = puVar16 + (long)pvVar4;
              puVar40 = puVar32 + (long)pvVar4;
              lVar31 = (long)pvVar4 + (long)local_168;
              puVar38 = (undefined1 *)((long)pvVar4 + lVar17 + local_140);
              for (iVar27 = 1; iVar27 < iVar34; iVar27 = iVar27 + 2) {
                *puVar14 = *(undefined1 *)(lVar21 + lVar17);
                puVar14[1] = *(undefined1 *)(lVar31 + lVar17);
                puVar14[2] = *(undefined1 *)(lVar21 + 1 + lVar17);
                puVar14[3] = puVar40[lVar17];
                puVar14[4] = *(undefined1 *)(lVar21 + 2 + lVar17);
                puVar14[5] = puVar24[lVar17];
                puVar14[6] = *(undefined1 *)(lVar21 + 3 + lVar17);
                puVar14[7] = puVar39[lVar17];
                puVar14 = puVar14 + 8;
                lVar21 = lVar21 + lVar36;
                puVar39 = puVar39 + lVar36;
                puVar24 = puVar24 + lVar36;
                puVar40 = puVar40 + lVar36;
                lVar31 = lVar31 + lVar36;
                puVar38 = puVar38 + lVar36;
              }
              for (iVar27 = iVar27 + -1; iVar27 < iVar34; iVar27 = iVar27 + 1) {
                *puVar14 = puVar38[-1];
                puVar14[1] = *puVar38;
                puVar14[2] = puVar38[1];
                puVar14[3] = puVar38[2];
                puVar14 = puVar14 + 4;
                puVar38 = puVar38 + lVar18;
              }
              uVar20 = uVar20 + 4;
              local_168 = (undefined1 *)((long)local_168 + 4);
              local_140 = local_140 + 4;
              pMVar42 = (Mat *)((long)&pMVar23->data + 4);
              puVar39 = puVar32 + 4;
              puVar24 = puVar16 + 4;
              this = local_f8;
              local_158 = puVar16;
              local_150 = puVar32;
              local_148 = pMVar23;
            }
            for (; (long)(uVar29 | 1) < (long)local_d8; uVar29 = uVar29 + 2) {
              pvVar4 = (this->super_Gemm).A_data.data;
              lVar17 = (long)(this->super_Gemm).A_data.w * (long)local_120 *
                       (this->super_Gemm).A_data.elemsize;
              lVar21 = (long)pvVar4 + uVar20;
              puVar39 = puVar32 + (long)pvVar4;
              lVar31 = (long)pvVar4 + (long)local_168;
              for (iVar27 = 1; iVar27 < iVar34; iVar27 = iVar27 + 2) {
                *puVar14 = *(undefined1 *)(lVar21 + lVar17);
                puVar14[1] = *(undefined1 *)(lVar31 + lVar17);
                puVar14[2] = *(undefined1 *)(lVar21 + 1 + lVar17);
                puVar14[3] = puVar39[lVar17];
                puVar14 = puVar14 + 4;
                lVar21 = lVar21 + lVar36;
                puVar39 = puVar39 + lVar36;
                lVar31 = lVar31 + lVar36;
              }
              for (iVar27 = iVar27 + -1; iVar27 < iVar34; iVar27 = iVar27 + 1) {
                *puVar14 = *(undefined1 *)(lVar21 + lVar17);
                puVar14[1] = *(undefined1 *)(lVar21 + 1 + lVar17);
                puVar14 = puVar14 + 2;
                lVar17 = lVar17 + lVar18;
              }
              uVar20 = uVar20 + 2;
              puVar32 = puVar32 + 2;
              local_168 = (undefined1 *)((long)local_168 + 2);
              this = local_f8;
            }
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            for (; uVar20 = local_128, (long)uVar29 < (long)local_d8; uVar29 = uVar29 + 1) {
              puVar39 = (undefined1 *)
                        ((long)(this->super_Gemm).A_data.data +
                        local_128 +
                        uVar29 + (long)(this->super_Gemm).A_data.w * (long)local_120 *
                                 (this->super_Gemm).A_data.elemsize);
              iVar27 = iVar34;
              while (bVar43 = iVar27 != 0, iVar27 = iVar27 + -1, bVar43) {
                *puVar14 = *puVar39;
                puVar14 = puVar14 + 1;
                puVar39 = puVar39 + lVar18;
              }
            }
          }
          iVar27 = TILE_K;
          iVar26 = (int)local_e0 + TILE_K;
        }
        iVar34 = local_134 + 1;
      }
      if (local_110->lightmode != false) {
        piVar5 = (this->super_Gemm).A_data.refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            pAVar6 = (this->super_Gemm).A_data.allocator;
            if (pAVar6 == (Allocator *)0x0) {
              free((this->super_Gemm).A_data.data);
            }
            else {
              (*pAVar6->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&local_130->refcount + 4) = (undefined1  [16])0x0;
        local_130->data = (void *)0x0;
        local_130->refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_004294ea;
    }
LAB_00429ee8:
    iVar34 = -100;
  }
  return iVar34;
}

Assistant:

int Gemm_x86::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}